

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

Ivy_Man_t * Ivy_FraigMiter(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  void *pvVar1;
  Ivy_Man_t *p;
  void *__ptr;
  int iVar2;
  Ivy_FraigMan_t *p_00;
  Ivy_Man_t *pIVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Ivy_Obj_t *p1;
  Ivy_Obj_t *pIVar9;
  long lVar10;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pManAig->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(pManAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x1e8,"Ivy_Man_t *Ivy_FraigMiter(Ivy_Man_t *, Ivy_FraigParams_t *)");
  }
  p_00 = (Ivy_FraigMan_t *)calloc(1,0x138);
  p_00->pParams = pParams;
  p_00->pManAig = pManAig;
  pIVar3 = Ivy_ManStartFrom(pManAig);
  p_00->pManFraig = pIVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  p_00->vPiVars = pVVar4;
  pVVar4 = pManAig->vObjs;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar10];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_007ef650;
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pIVar9 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar9 = (Ivy_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x48));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Ivy_Obj_t *)0x0;
        }
        else {
          p1 = (Ivy_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x18) & 1) ^ *(ulong *)(uVar6 + 0x48));
        }
        pIVar9 = Ivy_And(pIVar3,pIVar9,p1);
        *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar9;
        pVVar4 = pManAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar4->nSize);
  }
  Ivy_FraigMiterProve(p_00);
  pIVar3 = p_00->pManAig;
  p = p_00->pManFraig;
  pVVar4 = pIVar3->vPos;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      if (((ulong)pVVar4->pArray[lVar10] & 1) != 0) {
LAB_007ef650:
        __assert_fail("!Ivy_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                      ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pVVar4->pArray[lVar10] + 0x10);
      uVar7 = uVar6 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pIVar9 = (Ivy_Obj_t *)0x0;
      }
      else {
        pIVar9 = (Ivy_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x48));
      }
      Ivy_ObjCreatePo(p,pIVar9);
      lVar10 = lVar10 + 1;
      pVVar4 = pIVar3->vPos;
    } while (lVar10 < pVVar4->nSize);
  }
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar10];
      if (pvVar1 != (void *)0x0) {
        __ptr = *(void **)((long)pvVar1 + 0x30);
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
          }
          free(__ptr);
          pVVar4 = p->vObjs;
        }
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
        *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar4->nSize);
  }
  Ivy_ManCleanup(p);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p_00->timeTotal = lVar10 + lVar8;
  Ivy_FraigStop(p_00);
  return p;
}

Assistant:

Ivy_Man_t * Ivy_FraigMiter( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_Man_t * pManAigNew;
    Ivy_Obj_t * pObj;
    int i;
    abctime clk;
clk = Abc_Clock();
    assert( Ivy_ManLatchNum(pManAig) == 0 );
    p = Ivy_FraigStartSimple( pManAig, pParams );
    // set global limits
    p->nBTLimitGlobal  = s_nBTLimitGlobal;
    p->nInsLimitGlobal = s_nInsLimitGlobal; 
    // duplicate internal nodes
    Ivy_ManForEachNode( p->pManAig, pObj, i )
        pObj->pEquiv = Ivy_And( p->pManFraig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
    // try to prove each output of the miter
    Ivy_FraigMiterProve( p );
    // add the POs
    Ivy_ManForEachPo( p->pManAig, pObj, i )
        Ivy_ObjCreatePo( p->pManFraig, Ivy_ObjChild0Equiv(pObj) );
    // clean the new manager
    Ivy_ManForEachObj( p->pManFraig, pObj, i )
    {
        if ( Ivy_ObjFaninVec(pObj) )
            Vec_PtrFree( Ivy_ObjFaninVec(pObj) );
        pObj->pNextFan0 = pObj->pNextFan1 = NULL;
    }
    // remove dangling nodes 
    Ivy_ManCleanup( p->pManFraig );
    pManAigNew = p->pManFraig;
p->timeTotal = Abc_Clock() - clk;

//printf( "Final nodes = %6d. ", Ivy_ManNodeNum(pManAigNew) );
//ABC_PRT( "Time", p->timeTotal );
    Ivy_FraigStop( p );
    return pManAigNew;
}